

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * anon_unknown.dwarf_10d873::CreateStore
                    (ExpressionContext *ctx,VmModule *module,SynBase *source,TypeBase *type,
                    VmValue *address,VmValue *value,uint offset)

{
  Allocator *pAVar1;
  VariableData *pVVar2;
  int iVar3;
  VmInstructionType VVar4;
  TypeRef *pTVar5;
  VmConstant *pVVar6;
  VmValue *pVVar7;
  VmConstant *pVVar8;
  VmInstruction *pVVar9;
  undefined4 extraout_var;
  VmValue *pVVar10;
  VmType VVar11;
  int in_stack_ffffffffffffff78;
  VmValue *in_stack_ffffffffffffff98;
  
  VVar11 = GetVmType(ctx,type);
  if (((value->type).type != VVar11.type) || ((value->type).size != VVar11.size)) {
    __assert_fail("value->type == GetVmType(ctx, type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x37f,
                  "VmValue *(anonymous namespace)::CreateStore(ExpressionContext &, VmModule *, SynBase *, TypeBase *, VmValue *, VmValue *, unsigned int)"
                 );
  }
  if (type->size == 0) {
    iVar3 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98,VVar11.structType);
    pVVar9 = (VmInstruction *)CONCAT44(extraout_var,iVar3);
    pAVar1 = module->allocator;
    (pVVar9->super_VmValue).typeID = 0;
    (pVVar9->super_VmValue).source = (SynBase *)0x0;
    (pVVar9->super_VmValue).comment.begin = (char *)0x0;
    (pVVar9->super_VmValue).type.type = VM_TYPE_VOID;
    (pVVar9->super_VmValue).type.size = 0;
    (pVVar9->super_VmValue).type.structType = (TypeBase *)0x0;
    (pVVar9->super_VmValue).comment.end = (char *)0x0;
    (pVVar9->super_VmValue).users.allocator = pAVar1;
    (pVVar9->super_VmValue).users.data = (pVVar9->super_VmValue).users.little;
    (pVVar9->super_VmValue).users.count = 0;
    (pVVar9->super_VmValue).users.max = 8;
    (pVVar9->super_VmValue).hasSideEffects = false;
    (pVVar9->super_VmValue).hasMemoryAccess = false;
    (pVVar9->super_VmValue).canBeRemoved = true;
    (pVVar9->super_VmValue).hasKnownSimpleUse = false;
    (pVVar9->super_VmValue).hasKnownNonSimpleUse = false;
    (pVVar9->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_0022ac70;
  }
  else {
    if ((address == (VmValue *)0x0) || (pVVar10 = address, address->typeID != 1)) {
      pVVar10 = (VmValue *)0x0;
    }
    if (pVVar10 != (VmValue *)0x0) {
      pAVar1 = module->allocator;
      iVar3 = *(int *)&pVVar10[1]._vptr_VmValue;
      pVVar2 = (VariableData *)pVVar10[1].comment.end;
      pTVar5 = ExpressionContext::GetReferenceType(ctx,type);
      pVVar6 = CreateConstantPointer
                         (pAVar1,source,iVar3 + offset,pVVar2,&pTVar5->super_TypeBase,true);
      if ((value == (VmValue *)0x0) || (pVVar7 = value, value->typeID != 1)) {
        pVVar7 = (VmValue *)0x0;
      }
      if ((pVVar7 == (VmValue *)0x0) || (pVVar7[1].hasMemoryAccess != true)) {
        VVar4 = GetStoreInstruction(ctx,type);
        pVVar8 = CreateConstantInt(ctx->allocator,source,0);
        pVVar9 = CreateInstruction((anon_unknown_dwarf_10d873 *)module,(VmModule *)source,
                                   (SynBase *)0x0,(VmType)(ZEXT416(VVar4) << 0x40),
                                   (VmInstructionType)pVVar6,&pVVar8->super_VmValue,value,
                                   (VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffff98);
      }
      else {
        pAVar1 = ctx->allocator;
        iVar3 = *(int *)&pVVar7[1]._vptr_VmValue;
        pVVar2 = (VariableData *)pVVar7[1].comment.end;
        pTVar5 = ExpressionContext::GetReferenceType(ctx,type);
        pVVar8 = CreateConstantPointer(pAVar1,source,iVar3,pVVar2,&pTVar5->super_TypeBase,true);
        pVVar9 = (VmInstruction *)
                 CreateMemCopy(module,source,&pVVar6->super_VmValue,0,&pVVar8->super_VmValue,
                               (uint)type->size,in_stack_ffffffffffffff78);
      }
      if (pVVar10 != (VmValue *)0x0) {
        return &pVVar9->super_VmValue;
      }
    }
    if ((value == (VmValue *)0x0) || (pVVar10 = value, value->typeID != 1)) {
      pVVar10 = (VmValue *)0x0;
    }
    if ((pVVar10 != (VmValue *)0x0) && (pVVar10[1].hasMemoryAccess == true)) {
      pAVar1 = ctx->allocator;
      iVar3 = *(int *)&pVVar10[1]._vptr_VmValue;
      pVVar2 = (VariableData *)pVVar10[1].comment.end;
      pTVar5 = ExpressionContext::GetReferenceType(ctx,type);
      pVVar6 = CreateConstantPointer(pAVar1,source,iVar3,pVVar2,&pTVar5->super_TypeBase,true);
      pVVar10 = CreateMemCopy(module,source,address,offset,&pVVar6->super_VmValue,(uint)type->size,
                              offset);
      return pVVar10;
    }
    VVar4 = GetStoreInstruction(ctx,type);
    pVVar6 = CreateConstantInt(ctx->allocator,source,offset);
    pVVar9 = CreateInstruction((anon_unknown_dwarf_10d873 *)module,(VmModule *)source,(SynBase *)0x0
                               ,(VmType)(ZEXT416(VVar4) << 0x40),(VmInstructionType)address,
                               &pVVar6->super_VmValue,value,(VmValue *)0x0,(VmValue *)0x0,
                               in_stack_ffffffffffffff98);
  }
  return &pVVar9->super_VmValue;
}

Assistant:

VmValue* CreateStore(ExpressionContext &ctx, VmModule *module, SynBase *source, TypeBase *type, VmValue *address, VmValue *value, unsigned offset)
	{
		assert(value->type == GetVmType(ctx, type));

		if(type->size == 0)
			return CreateVoid(module);

		if(VmConstant *constantAddress = getType<VmConstant>(address))
		{
			VmConstant *shiftAddress = CreateConstantPointer(module->allocator, source, constantAddress->iValue + offset, constantAddress->container, ctx.GetReferenceType(type), true);

			if(VmConstant *constant = getType<VmConstant>(value))
			{
				if(constant->isReference)
				{
					VmConstant *pointer = CreateConstantPointer(ctx.allocator, source, constant->iValue, constant->container, ctx.GetReferenceType(type), true);

					return CreateMemCopy(module, source, shiftAddress, 0, pointer, 0, int(type->size));
				}
			}

			return CreateInstruction(module, source, VmType::Void, GetStoreInstruction(ctx, type), shiftAddress, CreateConstantInt(ctx.allocator, source, 0), value);
		}

		if(VmConstant *constant = getType<VmConstant>(value))
		{
			if(constant->isReference)
			{
				VmConstant *pointer = CreateConstantPointer(ctx.allocator, source, constant->iValue, constant->container, ctx.GetReferenceType(type), true);

				return CreateMemCopy(module, source, address, offset, pointer, 0, int(type->size));
			}
		}

		return CreateInstruction(module, source, VmType::Void, GetStoreInstruction(ctx, type), address, CreateConstantInt(ctx.allocator, source, offset), value);
	}